

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linearfit.cpp
# Opt level: O2

bool __thiscall
Logarithm::setSample(Logarithm *this,double *x,double *y,int count,bool enableWeight,double *w)

{
  bool bVar1;
  double *x_00;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  double dVar5;
  
  Polynomial::copy(&this->super_Polynomial,(EVP_PKEY_CTX *)x,(EVP_PKEY_CTX *)y);
  uVar4 = 0;
  uVar2 = 0xffffffffffffffff;
  if (-1 < count) {
    uVar2 = (ulong)(uint)count << 3;
  }
  uVar3 = 0;
  if (0 < count) {
    uVar3 = (ulong)(uint)count;
  }
  x_00 = (double *)operator_new__(uVar2);
  do {
    if (uVar3 == uVar4) {
      bVar1 = PolynomialFit::setSample((PolynomialFit *)this,x_00,y,count,enableWeight,w);
LAB_00103c61:
      operator_delete__(x_00);
      return bVar1;
    }
    if (x[uVar4] <= 0.0) {
      bVar1 = false;
      goto LAB_00103c61;
    }
    dVar5 = log(x[uVar4]);
    x_00[uVar4] = dVar5;
    uVar4 = uVar4 + 1;
  } while( true );
}

Assistant:

bool Logarithm::setSample(double *x, double *y, int count, bool enableWeight, double *w)
{
    //��ȡһ������
    copy(x,y,count);

    //����
    double *px = new double[count];
    for(int i(0) ; i<count ; i++){
        if(x[i] <= 0.0){
            delete [] px;
            return false;
        }

        px[i] = log(x[i]);
    }

    bool ret = PolynomialFit::setSample(px,y,count,enableWeight,w);
    delete [] px;
    return ret;
}